

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_16ac71::StatTask::start(StatTask *this,TaskInterface ti)

{
  size_t in_RCX;
  StringRef path;
  TaskInterface local_68;
  string local_58 [32];
  string local_38 [32];
  
  local_68.ctx = ti.ctx;
  local_68.impl = ti.impl;
  path.Length = in_RCX;
  path.Data = (char *)(this->statnode->name)._M_string_length;
  llbuild::buildsystem::BuildKey::makeNode
            ((BuildKey *)local_58,(BuildKey *)(this->statnode->name)._M_dataplus._M_p,path);
  std::__cxx11::string::string(local_38,local_58);
  llbuild::core::TaskInterface::mustFollow(&local_68,(KeyType *)local_38);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Create a weak link on any potential producer nodes so that we get up to
    // date stat information. We always run (see isResultValid) so this should
    // be safe (unlike directory contents where it may not run).
    ti.mustFollow(BuildKey::makeNode(statnode.getName()).toData());
  }